

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O1

QPDFObjectHandle __thiscall QPDFParser::parse(QPDFParser *this,bool *empty,bool content_stream)

{
  long lVar1;
  long lVar2;
  InputSource *this_00;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  qpdf_offset_t qVar6;
  string *psVar7;
  char in_CL;
  long lVar8;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar9;
  string s;
  ParseGuard pg;
  string local_50;
  ParseGuard local_30;
  
  local_30.qpdf = *(QPDF **)(empty + 0x20);
  if (local_30.qpdf != (QPDF *)0x0) {
    QPDF::inParse(local_30.qpdf,true);
  }
  *(undefined1 *)CONCAT71(in_register_00000011,content_stream) = 0;
  uVar5 = (**(code **)(**(long **)empty + 0x20))();
  *(undefined8 *)(empty + 0x78) = uVar5;
  bVar3 = ::qpdf::Tokenizer::nextToken
                    (*(Tokenizer **)(empty + 0x10),*(InputSource **)empty,*(string **)(empty + 8),0)
  ;
  if (!bVar3) {
    lVar1 = *(long *)(empty + 0x10);
    qVar6 = InputSource::getLastOffset(*(InputSource **)empty);
    warn((QPDFParser *)empty,qVar6,(string *)(lVar1 + 0x50));
  }
  lVar1 = *(long *)(empty + 0x10);
  switch(*(undefined4 *)(lVar1 + 8)) {
  case 0:
    psVar7 = (string *)operator_new(0x70);
    break;
  case 1:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"treating unexpected array close token as null","");
    qVar6 = InputSource::getLastOffset(*(InputSource **)empty);
    warn((QPDFParser *)empty,qVar6,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    psVar7 = (string *)operator_new(0x70);
    break;
  case 2:
  case 6:
    std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::_M_erase_at_end
              ((vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_> *)
               (empty + 0x48),*(pointer *)(empty + 0x48));
    local_50._M_dataplus._M_p._0_4_ = (uint)(*(int *)(*(long *)(empty + 0x10) + 8) == 2) * 2;
    std::vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>>::
    emplace_back<InputSource&,QPDFParser::parser_state_e>
              ((vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>> *)
               (empty + 0x48),*(InputSource **)empty,(parser_state_e *)&local_50);
    *(long *)(empty + 0x60) = *(long *)(empty + 0x50) + -0xa8;
    parseRemainder(this,SUB81(empty,0));
    goto LAB_001de6bf;
  case 3:
  case 4:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"treating unexpected brace token as null","");
    qVar6 = InputSource::getLastOffset(*(InputSource **)empty);
    warn((QPDFParser *)empty,qVar6,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    psVar7 = (string *)operator_new(0x70);
    break;
  case 5:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"unexpected dictionary close token","");
    qVar6 = InputSource::getLastOffset(*(InputSource **)empty);
    warn((QPDFParser *)empty,qVar6,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    psVar7 = (string *)operator_new(0x70);
    break;
  case 7:
    local_50._M_dataplus._M_p = (pointer)QUtil::string_to_ll(*(char **)(lVar1 + 0x30));
    withDescription<QPDF_Integer,long_long>(this,(longlong *)empty);
    goto LAB_001de6bf;
  case 8:
    withDescription<QPDF_Name,std::__cxx11::string_const&>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
    goto LAB_001de6bf;
  case 9:
    withDescription<QPDF_Real,std::__cxx11::string_const&>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
    goto LAB_001de6bf;
  case 10:
    if (*(long *)(empty + 0x18) == 0) {
      withDescription<QPDF_String,std::__cxx11::string_const&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
    }
    else {
      lVar8 = (ulong)((*(uint *)(lVar1 + 8) & 0xfffffffd) != 8) * 0x20;
      lVar2 = *(long *)(lVar1 + 0x10 + lVar8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar2,*(long *)(lVar1 + 0x18 + lVar8) + lVar2);
      (**(code **)(**(long **)(empty + 0x18) + 0x10))(*(long **)(empty + 0x18),&local_50);
      withDescription<QPDF_String,std::__cxx11::string&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    goto LAB_001de6bf;
  case 0xb:
    psVar7 = (string *)operator_new(0x70);
    break;
  case 0xc:
    iVar4 = std::__cxx11::string::compare((char *)(lVar1 + 0x30));
    local_50._M_dataplus._M_p._0_1_ = iVar4 == 0;
    withDescription<QPDF_Bool,bool>(this,empty);
    goto LAB_001de6bf;
  case 0xd:
    if (in_CL != '\0') {
      withDescription<QPDF_Operator,std::__cxx11::string_const&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
      goto LAB_001de6bf;
    }
    iVar4 = std::__cxx11::string::compare((char *)(lVar1 + 0x30));
    if (iVar4 != 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"unknown token while reading object; treating as string","");
      warn((QPDFParser *)empty,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      withDescription<QPDF_String,std::__cxx11::string_const&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
      goto LAB_001de6bf;
    }
    this_00 = *(InputSource **)empty;
    qVar6 = InputSource::getLastOffset(this_00);
    (*this_00->_vptr_InputSource[5])(this_00,qVar6,0);
    *(undefined1 *)CONCAT71(in_register_00000011,content_stream) = 1;
    psVar7 = (string *)operator_new(0x70);
    break;
  case 0xe:
    if (in_CL != '\0') {
      this->input = (InputSource *)0x0;
      this->object_description = (string *)0x0;
      goto LAB_001de6bf;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unexpected EOF","");
    qVar6 = InputSource::getLastOffset(*(InputSource **)empty);
    warn((QPDFParser *)empty,qVar6,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    psVar7 = (string *)operator_new(0x70);
    break;
  default:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"treating unknown token type as null while reading object","");
    qVar6 = InputSource::getLastOffset(*(InputSource **)empty);
    warn((QPDFParser *)empty,qVar6,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    psVar7 = (string *)operator_new(0x70);
  }
  psVar7->_M_string_length = 0x100000001;
  (psVar7->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_002eeae8;
  *(undefined1 *)&psVar7[2]._M_dataplus._M_p = 2;
  psVar7[2]._M_string_length = 0;
  psVar7[2].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&psVar7[2].field_2 + 8) = 0;
  psVar7[3]._M_dataplus._M_p = (pointer)0x0;
  psVar7[3]._M_string_length = 0xffffffffffffffff;
  this->input = (InputSource *)&psVar7->field_2;
  this->object_description = psVar7;
LAB_001de6bf:
  QPDF::ParseGuard::~ParseGuard(&local_30);
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFParser::parse(bool& empty, bool content_stream)
{
    // This method must take care not to resolve any objects. Don't check the type of any object
    // without first ensuring that it is a direct object. Otherwise, doing so may have the side
    // effect of reading the object and changing the file pointer. If you do this, it will cause a
    // logic error to be thrown from QPDF::inParse().

    QPDF::ParseGuard pg(context);
    empty = false;
    start = input.tell();

    if (!tokenizer.nextToken(input, object_description)) {
        warn(tokenizer.getErrorMessage());
    }

    switch (tokenizer.getType()) {
    case QPDFTokenizer::tt_eof:
        if (content_stream) {
            // In content stream mode, leave object uninitialized to indicate EOF
            return {};
        }
        QTC::TC("qpdf", "QPDFParser eof in parse");
        warn("unexpected EOF");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_bad:
        QTC::TC("qpdf", "QPDFParser bad token in parse");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_brace_open:
    case QPDFTokenizer::tt_brace_close:
        QTC::TC("qpdf", "QPDFParser bad brace");
        warn("treating unexpected brace token as null");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_array_close:
        QTC::TC("qpdf", "QPDFParser bad array close");
        warn("treating unexpected array close token as null");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_dict_close:
        QTC::TC("qpdf", "QPDFParser bad dictionary close");
        warn("unexpected dictionary close token");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_array_open:
    case QPDFTokenizer::tt_dict_open:
        stack.clear();
        stack.emplace_back(
            input,
            (tokenizer.getType() == QPDFTokenizer::tt_array_open) ? st_array : st_dictionary_key);
        frame = &stack.back();
        return parseRemainder(content_stream);

    case QPDFTokenizer::tt_bool:
        return withDescription<QPDF_Bool>(tokenizer.getValue() == "true");

    case QPDFTokenizer::tt_null:
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_integer:
        return withDescription<QPDF_Integer>(QUtil::string_to_ll(tokenizer.getValue().c_str()));

    case QPDFTokenizer::tt_real:
        return withDescription<QPDF_Real>(tokenizer.getValue());

    case QPDFTokenizer::tt_name:
        return withDescription<QPDF_Name>(tokenizer.getValue());

    case QPDFTokenizer::tt_word:
        {
            auto const& value = tokenizer.getValue();
            if (content_stream) {
                return withDescription<QPDF_Operator>(value);
            } else if (value == "endobj") {
                // We just saw endobj without having read anything.  Treat this as a null and do
                // not move the input source's offset.
                input.seek(input.getLastOffset(), SEEK_SET);
                empty = true;
                return {QPDFObject::create<QPDF_Null>()};
            } else {
                QTC::TC("qpdf", "QPDFParser treat word as string");
                warn("unknown token while reading object; treating as string");
                return withDescription<QPDF_String>(value);
            }
        }

    case QPDFTokenizer::tt_string:
        if (decrypter) {
            std::string s{tokenizer.getValue()};
            decrypter->decryptString(s);
            return withDescription<QPDF_String>(s);
        } else {
            return withDescription<QPDF_String>(tokenizer.getValue());
        }

    default:
        warn("treating unknown token type as null while reading object");
        return {QPDFObject::create<QPDF_Null>()};
    }
}